

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioEntityType.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::RadioEntityType::operator==(RadioEntityType *this,RadioEntityType *Value)

{
  long lVar1;
  long lVar2;
  
  lVar1._0_1_ = this->m_ui8EntityKind;
  lVar1._1_1_ = this->m_ui8Domain;
  lVar1._2_2_ = this->m_ui16Country;
  lVar1._4_1_ = this->m_ui8Category;
  lVar1._5_1_ = this->m_ui8NomenclatureVersion;
  lVar1._6_2_ = this->m_ui16Nomenclature;
  lVar2._0_1_ = Value->m_ui8EntityKind;
  lVar2._1_1_ = Value->m_ui8Domain;
  lVar2._2_2_ = Value->m_ui16Country;
  lVar2._4_1_ = Value->m_ui8Category;
  lVar2._5_1_ = Value->m_ui8NomenclatureVersion;
  lVar2._6_2_ = Value->m_ui16Nomenclature;
  return lVar1 == lVar2;
}

Assistant:

KBOOL RadioEntityType::operator == ( const RadioEntityType & Value ) const
{
    if( m_ui8EntityKind           != Value.m_ui8EntityKind )          return false;
    if( m_ui8Domain               != Value.m_ui8Domain )              return false;
    if( m_ui16Country             != Value.m_ui16Country )            return false;
    if( m_ui8Category             != Value.m_ui8Category )            return false;
    if( m_ui8NomenclatureVersion  != Value.m_ui8NomenclatureVersion ) return false;
    if( m_ui16Nomenclature        != Value.m_ui16Nomenclature )       return false;
    return true;
}